

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_test.cc
# Opt level: O2

void __thiscall
IntegrationTest_TestMultipartUpload_largefile_Test::
~IntegrationTest_TestMultipartUpload_largefile_Test
          (IntegrationTest_TestMultipartUpload_largefile_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(IntegrationTest, TestMultipartUpload_largefile)
{
	Qiniu_Int64 partSize[] = {2 << 20, 4 << 20};
	for (int i = 0; i < sizeof(partSize) / sizeof(partSize[0]); i++)
	{
		Qiniu_Client client;
		Qiniu_Zero(client);

		Qiniu_Error err;
		Qiniu_Mac mac = {QINIU_ACCESS_KEY, QINIU_SECRET_KEY};
		Qiniu_Client_InitMacAuth(&client, 1024, &mac);
		Qiniu_Client_SetTimeout(&client, 5000);
		Qiniu_Client_SetConnectTimeout(&client, 3000);
		Qiniu_Client_EnableAutoQuery(&client, Qiniu_True);

		char inputKey[100];
		Qiniu_snprintf(inputKey, 100, "largefile_%d", rand());

		// step1: delete  file if exist
		Qiniu_RS_Delete(&client, Test_bucket, inputKey);

		// step2: upload file
		char filePath[PATH_MAX] = {0};
		strcpy(filePath, __SOURCE_DIR__);
		strcat(filePath, "/gtests/resources/test5m.mp3");
		const char *returnKey = putFile_multipart(Test_bucket, inputKey, "mp3", (const char *)filePath, partSize[i], &mac);

		// step3: stat file
		Qiniu_RS_StatRet statResult;
		err = Qiniu_RS_Stat(&client, &statResult, Test_bucket, returnKey);
		EXPECT_EQ(err.code, 200);
		EXPECT_STREQ(statResult.mimeType, "mp3");
		EXPECT_EQ(statResult.fsize, 5097014);

		// step4: delete file
		err = Qiniu_RS_Delete(&client, Test_bucket, returnKey);
		EXPECT_EQ(err.code, 200);

		Qiniu_Client_Cleanup(&client);
	}
}